

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtppacket.h
# Opt level: O1

void __thiscall jrtplib::RTPPacket::~RTPPacket(RTPPacket *this)

{
  RTPMemoryManager *pRVar1;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__RTPPacket_0013cb88;
  if ((this->packet != (uint8_t *)0x0) && (this->externalbuffer == false)) {
    pRVar1 = (this->super_RTPMemoryObject).mgr;
    if (pRVar1 == (RTPMemoryManager *)0x0) {
      operator_delete__(this->packet);
      return;
    }
    (**(code **)(*(long *)pRVar1 + 0x18))();
  }
  return;
}

Assistant:

virtual ~RTPPacket()																{ if (packet && !externalbuffer) RTPDeleteByteArray(packet,GetMemoryManager());  }